

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwriter_buffer.c
# Opt level: O2

void aom_wb_write_signed_primitive_refsubexpfin
               (aom_write_bit_buffer *wb,uint16_t n,uint16_t k,int16_t ref,int16_t v)

{
  uint16_t uVar1;
  uint16_t r;
  uint bits;
  int iVar2;
  uint uVar3;
  short sVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  
  r = (n - 1) + ref;
  uVar1 = (n - 1) + v;
  uVar5 = (uint)(ushort)(n * 2 - 1);
  if (uVar5 < (uint)r * 2) {
    sVar4 = n * 2 + -2;
    r = sVar4 - r;
    uVar1 = sVar4 - uVar1;
  }
  uVar1 = recenter_nonneg(r,uVar1);
  iVar2 = 0;
  iVar7 = 0;
  while( true ) {
    iVar6 = iVar7;
    bits = (k - 1) + iVar2;
    if (iVar2 == 0) {
      bits = (uint)k;
    }
    if ((int)uVar5 <= (3 << ((byte)bits & 0x1f)) + iVar6) break;
    iVar7 = (1 << ((byte)bits & 0x1f)) + iVar6;
    uVar3 = (uint)uVar1;
    aom_wb_write_bit(wb,(uint)(iVar7 <= (int)uVar3));
    iVar2 = iVar2 + 1;
    if ((int)uVar3 < iVar7) {
      uVar3 = uVar3 - iVar6;
LAB_00234e60:
      aom_wb_write_literal(wb,uVar3,bits);
      return;
    }
  }
  if ((ushort)(uVar5 - iVar6) < 2) {
    return;
  }
  uVar5 = uVar5 - iVar6 & 0xffff;
  bits = 0x1f;
  if (uVar5 != 0) {
    for (; uVar5 >> bits == 0; bits = bits - 1) {
    }
  }
  iVar7 = (2 << ((byte)bits & 0x1f)) - uVar5;
  uVar3 = (uint)uVar1 - iVar6 & 0xffff;
  if (iVar7 <= (int)uVar3) {
    aom_wb_write_literal(wb,((int)(uVar3 - iVar7) >> 1) + iVar7,bits);
    aom_wb_write_bit(wb,uVar3 - iVar7 & 1);
    return;
  }
  goto LAB_00234e60;
}

Assistant:

void aom_wb_write_signed_primitive_refsubexpfin(struct aom_write_bit_buffer *wb,
                                                uint16_t n, uint16_t k,
                                                int16_t ref, int16_t v) {
  ref += n - 1;
  v += n - 1;
  const uint16_t scaled_n = (n << 1) - 1;
  wb_write_primitive_refsubexpfin(wb, scaled_n, k, ref, v);
}